

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

byte * __thiscall
Js::InterpreterStackFrame::OP_ProfiledLoopStart<(Js::LayoutSize)0,false>
          (InterpreterStackFrame *this,byte *ip)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  ImplicitCallFlags IVar4;
  OpLayoutT_Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *pOVar5;
  ScriptContext *this_00;
  ThreadContext *this_01;
  FunctionBody *functionBody;
  undefined4 *puVar6;
  ThreadContext *threadContext;
  InterpreterStackFrame *pIStack_20;
  uint32 C1;
  byte *ip_local;
  InterpreterStackFrame *this_local;
  
  pIStack_20 = (InterpreterStackFrame *)ip;
  ip_local = (byte *)this;
  pOVar5 = ByteCodeReader::
           GetLayout<Js::OpLayoutT_Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
                     ((ByteCodeReader *)this,(byte **)&stack0xffffffffffffffe0);
  bVar1 = pOVar5->C1;
  if (((byte)this[0xd6] >> 4 & 1) == 0) {
    this_local = pIStack_20;
  }
  else {
    this_00 = GetScriptContext(this);
    this_01 = ScriptContext::GetThreadContext(this_00);
    ThreadContext::IncrementLoopDepth(this_01);
    functionBody = GetFunctionBody(this);
    bVar3 = DynamicProfileInfo::EnableImplicitCallFlags(functionBody);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x16b3,
                                  "(Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody()))"
                                  ,
                                  "Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody())"
                                 );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    IVar4 = ThreadContext::GetImplicitCallFlags(this_01);
    *(ImplicitCallFlags *)(*(long *)(this + 0xc0) + (ulong)bVar1) = IVar4;
    ThreadContext::SetImplicitCallFlags(this_01,ImplicitCall_None);
    *(undefined4 *)(this + 0xd0) = 0;
    this_local = pIStack_20;
  }
  return (byte *)this_local;
}

Assistant:

const byte * InterpreterStackFrame::OP_ProfiledLoopStart(const byte * ip)
    {
        const uint32 C1 = m_reader.GetLayout<OpLayoutT_Unsigned1<LayoutSizePolicy<layoutSize>>>(ip)->C1;
        if (!profiled && !isAutoProfiling)
        {
            return ip;
        }

        ThreadContext *const threadContext = GetScriptContext()->GetThreadContext();
        threadContext->IncrementLoopDepth();

        // Save the implicit call flags. The interpreter may switch to profiling mode during LoopBodyStart, so always do this.
        Assert(Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody()));
        this->savedLoopImplicitCallFlags[C1] = threadContext->GetImplicitCallFlags();
        threadContext->SetImplicitCallFlags(ImplicitCall_None);

        this->currentLoopCounter = 0;

        if (!profiled)
        {
            return ip;
        }

        LayoutSize localLayoutSize;
        OpCode peekOp = m_reader.PeekOp(ip, localLayoutSize);
        Assert(peekOp != OpCode::LoopBodyStart);
        if (peekOp == OpCode::ProfiledLoopBodyStart)
        {
            Assert(localLayoutSize == layoutSize);
            ip += Js::OpCodeUtil::EncodedSize(peekOp, layoutSize);
            // We are doing JIT loop body. Process the first ProfiledLoopBodyStart to avoid recording
            // the implicit call before the first iteration
            uint32 C2 = m_reader.GetLayout<OpLayoutT_Unsigned1<LayoutSizePolicy<layoutSize>>>(ip)->C1;
            Assert(C1 == C2);
            (this->*opProfiledLoopBodyStart)(C1, layoutSize, true /* isFirstIteration */);
            return m_reader.GetIP();
        }

        return ip;
    }